

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_assign_expr2(JSParseState *s,int parse_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PutLValueEnum PVar5;
  undefined4 in_ESI;
  JSParseState *in_RDI;
  bool bVar6;
  int label2;
  int depth_lvalue;
  int label1;
  int label_1;
  int label;
  int label_next_1;
  int label_throw2;
  int label_throw1;
  int label_throw;
  int label_yield;
  int label_return1;
  int label_next;
  int label_return;
  int label_loop;
  BOOL is_async;
  BOOL is_star;
  JSAtom name;
  JSAtom name0;
  int scope;
  int op;
  int opcode;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar7;
  JSAtom in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  BOOL in_stack_ffffffffffffff8c;
  uint8_t uVar8;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  PutLValueEnum in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  JSAtom in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  BOOL in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  JSAtom in_stack_ffffffffffffffd8;
  JSAtom JVar9;
  BOOL in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  int local_4;
  
  JVar9 = 0;
  if ((in_RDI->token).val == -0x29) {
    bVar1 = false;
    if ((*(ushort *)&in_RDI->cur_func->field_0x84 & 1) == 0) {
      local_4 = js_parse_error(in_RDI,"unexpected \'yield\' keyword");
    }
    else if (in_RDI->cur_func->in_function_body == 0) {
      local_4 = js_parse_error(in_RDI,"yield in default expression");
    }
    else {
      iVar2 = next_token((JSParseState *)(ulong)in_stack_ffffffffffffffd8);
      if (iVar2 == 0) {
        if (((((in_RDI->token).val == 0x3b) || ((in_RDI->token).val == 0x29)) ||
            ((in_RDI->token).val == 0x5d)) ||
           ((((in_RDI->token).val == 0x7d || ((in_RDI->token).val == 0x2c)) ||
            (((in_RDI->token).val == 0x3a || (in_RDI->got_lf != 0)))))) {
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
        }
        else {
          if ((in_RDI->token).val == 0x2a) {
            bVar1 = true;
            iVar2 = next_token((JSParseState *)CONCAT44(JVar9,in_stack_ffffffffffffffd8));
            if (iVar2 != 0) {
              return -1;
            }
          }
          iVar2 = js_parse_assign_expr2
                            ((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             in_stack_ffffffffffffffe4);
          if (iVar2 != 0) {
            return -1;
          }
        }
        bVar6 = (*(ushort *)&in_RDI->cur_func->field_0x84 & 0xff) == 3;
        if (bVar1) {
          new_label((JSParseState *)0x19b1f6);
          new_label((JSParseState *)0x19b204);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          }
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b2ca);
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          uVar8 = (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18);
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    uVar8);
            emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c);
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          }
          else {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    uVar8);
          }
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b353);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b379);
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_u32((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b3c8);
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          }
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (uint8_t)(in_stack_ffffffffffffff7c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b411);
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          }
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b46b);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_return((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
          uVar8 = (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18);
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (uint8_t)(in_stack_ffffffffffffff7c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b513);
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    uVar8);
          }
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b56d);
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b580);
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (uint8_t)(in_stack_ffffffffffffff7c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b5c0);
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    uVar8);
          }
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (uint8_t)(in_stack_ffffffffffffff7c >> 0x18));
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
        }
        else {
          if (bVar6) {
            emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          }
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
          emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                    0x19b6a6);
          emit_return((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
          emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0
                    );
        }
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
  }
  else {
    if ((in_RDI->token).val == -0x7d) {
      JVar9 = (in_RDI->token).u.ident.atom;
    }
    iVar2 = js_parse_cond_expr((JSParseState *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff84);
    uVar8 = (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18);
    if (iVar2 == 0) {
      iVar2 = (in_RDI->token).val;
      if ((iVar2 == 0x3d) || ((-0x7c < iVar2 && (iVar2 < -0x6f)))) {
        iVar3 = next_token((JSParseState *)CONCAT44(JVar9,in_stack_ffffffffffffffd8));
        if (iVar3 != 0) {
          return -1;
        }
        iVar3 = iVar2;
        iVar4 = get_lvalue((JSParseState *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (JSAtom *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
        if (iVar4 < 0) {
          return -1;
        }
        iVar4 = js_parse_assign_expr2
                          ((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),iVar3);
        if (iVar4 != 0) {
          JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff84,iVar2),
                      in_stack_ffffffffffffff7c);
          return -1;
        }
        if (iVar3 == 0x3d) {
          if ((in_stack_ffffffffffffffe8 == 0x3c) && (in_stack_ffffffffffffffd8 == JVar9)) {
            set_object_name((JSParseState *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
          }
        }
        else {
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  uVar8);
        }
        put_lvalue((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                   in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffffc0);
      }
      else if ((-0x70 < iVar2) && (iVar2 < -0x6c)) {
        iVar3 = next_token((JSParseState *)CONCAT44(JVar9,in_stack_ffffffffffffffd8));
        if (iVar3 != 0) {
          return -1;
        }
        uVar7 = 1;
        iVar3 = iVar2;
        iVar4 = get_lvalue((JSParseState *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (JSAtom *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
        if (iVar4 < 0) {
          return -1;
        }
        emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
        if (iVar3 == -0x6d) {
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
        }
        iVar4 = emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,uVar7),0,0x19b925);
        emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
        iVar3 = js_parse_assign_expr2
                          ((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),iVar3);
        if (iVar3 != 0) {
          JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff84,iVar2),
                      in_stack_ffffffffffffff7c);
          return -1;
        }
        if ((in_stack_ffffffffffffffe8 == 0x3c) && (in_stack_ffffffffffffffd8 == JVar9)) {
          set_object_name((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,iVar4),
                          in_stack_ffffffffffffff9c);
        }
        uVar8 = (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18);
        PVar5 = in_stack_ffffffffffffff9c;
        if (in_stack_ffffffffffffff9c == PUT_LVALUE_NOKEEP_DEPTH) {
          emit_op((JSParseState *)CONCAT44(1,in_stack_ffffffffffffff90),uVar8);
        }
        else if (in_stack_ffffffffffffff9c == PUT_LVALUE_KEEP_TOP) {
          emit_op((JSParseState *)CONCAT44(2,in_stack_ffffffffffffff90),uVar8);
        }
        else {
          if (in_stack_ffffffffffffff9c != PUT_LVALUE_KEEP_SECOND) {
            abort();
          }
          emit_op((JSParseState *)CONCAT44(3,in_stack_ffffffffffffff90),uVar8);
        }
        uVar7 = 0;
        put_lvalue((JSParseState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                   iVar4,PVar5,in_stack_ffffffffffffffc0);
        emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,uVar7),0,0x19ba26);
        emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,uVar7),0);
        for (; PVar5 != PUT_LVALUE_NOKEEP; PVar5 = PVar5 - PUT_LVALUE_NOKEEP_DEPTH) {
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90),
                  (uint8_t)((uint)in_stack_ffffffffffffff8c >> 0x18));
        }
        emit_label((JSParseState *)CONCAT44(in_stack_ffffffffffffff7c,uVar7),0);
      }
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static __exception int js_parse_assign_expr2(JSParseState *s, int parse_flags)
{
    int opcode, op, scope;
    JSAtom name0 = JS_ATOM_NULL;
    JSAtom name;

    if (s->token.val == TOK_YIELD) {
        BOOL is_star = FALSE, is_async;
        
        if (!(s->cur_func->func_kind & JS_FUNC_GENERATOR))
            return js_parse_error(s, "unexpected 'yield' keyword");
        if (!s->cur_func->in_function_body)
            return js_parse_error(s, "yield in default expression");
        if (next_token(s))
            return -1;
        /* XXX: is there a better method to detect 'yield' without
           parameters ? */
        if (s->token.val != ';' && s->token.val != ')' &&
            s->token.val != ']' && s->token.val != '}' &&
            s->token.val != ',' && s->token.val != ':' && !s->got_lf) {
            if (s->token.val == '*') {
                is_star = TRUE;
                if (next_token(s))
                    return -1;
            }
            if (js_parse_assign_expr2(s, parse_flags))
                return -1;
        } else {
            emit_op(s, OP_undefined);
        }
        is_async = (s->cur_func->func_kind == JS_FUNC_ASYNC_GENERATOR);

        if (is_star) {
            int label_loop, label_return, label_next;
            int label_return1, label_yield, label_throw, label_throw1;
            int label_throw2;

            label_loop = new_label(s);
            label_yield = new_label(s);

            emit_op(s, is_async ? OP_for_await_of_start : OP_for_of_start);

            /* remove the catch offset (XXX: could avoid pushing back
               undefined) */
            emit_op(s, OP_drop);
            emit_op(s, OP_undefined);
            
            emit_op(s, OP_undefined); /* initial value */
            
            emit_label(s, label_loop);
            emit_op(s, OP_iterator_next);
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_check_object);
            emit_op(s, OP_get_field2);
            emit_atom(s, JS_ATOM_done);
            label_next = emit_goto(s, OP_if_true, -1); /* end of loop */
            emit_label(s, label_yield);
            if (is_async) {
                /* OP_async_yield_star takes the value as parameter */
                emit_op(s, OP_get_field);
                emit_atom(s, JS_ATOM_value);
                emit_op(s, OP_await);
                emit_op(s, OP_async_yield_star);
            } else {
                /* OP_yield_star takes (value, done) as parameter */
                emit_op(s, OP_yield_star);
            }
            emit_op(s, OP_dup);
            label_return = emit_goto(s, OP_if_true, -1);
            emit_op(s, OP_drop);
            emit_goto(s, OP_goto, label_loop);
            
            emit_label(s, label_return);
            emit_op(s, OP_push_i32);
            emit_u32(s, 2);
            emit_op(s, OP_strict_eq);
            label_throw = emit_goto(s, OP_if_true, -1);
            
            /* return handling */
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_call);
            emit_u8(s, 0);
            label_return1 = emit_goto(s, OP_if_true, -1);
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_check_object);
            emit_op(s, OP_get_field2);
            emit_atom(s, JS_ATOM_done);
            emit_goto(s, OP_if_false, label_yield);

            emit_op(s, OP_get_field);
            emit_atom(s, JS_ATOM_value);
            
            emit_label(s, label_return1);
            emit_op(s, OP_nip);
            emit_op(s, OP_nip);
            emit_op(s, OP_nip);
            emit_return(s, TRUE);
            
            /* throw handling */
            emit_label(s, label_throw);
            emit_op(s, OP_iterator_call);
            emit_u8(s, 1);
            label_throw1 = emit_goto(s, OP_if_true, -1);
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_check_object);
            emit_op(s, OP_get_field2);
            emit_atom(s, JS_ATOM_done);
            emit_goto(s, OP_if_false, label_yield);
            emit_goto(s, OP_goto, label_next);
            /* close the iterator and throw a type error exception */
            emit_label(s, label_throw1);
            emit_op(s, OP_iterator_call);
            emit_u8(s, 2);
            label_throw2 = emit_goto(s, OP_if_true, -1);
            if (is_async)
                emit_op(s, OP_await);
            emit_label(s, label_throw2);

            emit_op(s, OP_throw_error);
            emit_atom(s, JS_ATOM_NULL);
            emit_u8(s, JS_THROW_ERROR_ITERATOR_THROW);
            
            emit_label(s, label_next);
            emit_op(s, OP_get_field);
            emit_atom(s, JS_ATOM_value);
            emit_op(s, OP_nip); /* keep the value associated with
                                   done = true */
            emit_op(s, OP_nip);
            emit_op(s, OP_nip);
        } else {
            int label_next;
            
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_yield);
            label_next = emit_goto(s, OP_if_false, -1);
            emit_return(s, TRUE);
            emit_label(s, label_next);
        }
        return 0;
    }
    if (s->token.val == TOK_IDENT) {
        /* name0 is used to check for OP_set_name pattern, not duplicated */
        name0 = s->token.u.ident.atom;
    }
    if (js_parse_cond_expr(s, parse_flags | PF_ARROW_FUNC))
        return -1;

    op = s->token.val;
    if (op == '=' || (op >= TOK_MUL_ASSIGN && op <= TOK_POW_ASSIGN)) {
        int label;
        if (next_token(s))
            return -1;
        if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, (op != '='), op) < 0)
            return -1;

        if (js_parse_assign_expr2(s, parse_flags)) {
            JS_FreeAtom(s->ctx, name);
            return -1;
        }

        if (op == '=') {
            if (opcode == OP_get_ref_value && name == name0) {
                set_object_name(s, name);
            }
        } else {
            static const uint8_t assign_opcodes[] = {
                OP_mul, OP_div, OP_mod, OP_add, OP_sub,
                OP_shl, OP_sar, OP_shr, OP_and, OP_xor, OP_or,
#ifdef CONFIG_BIGNUM
                OP_pow,
#endif
                OP_pow,
            };
            op = assign_opcodes[op - TOK_MUL_ASSIGN];
#ifdef CONFIG_BIGNUM
            if (s->cur_func->js_mode & JS_MODE_MATH) {
                if (op == OP_mod)
                    op = OP_math_mod;
            }
#endif
            emit_op(s, op);
        }
        put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_TOP, FALSE);
    } else if (op >= TOK_LAND_ASSIGN && op <= TOK_DOUBLE_QUESTION_MARK_ASSIGN) {
        int label, label1, depth_lvalue, label2;
        
        if (next_token(s))
            return -1;
        if (get_lvalue(s, &opcode, &scope, &name, &label,
                       &depth_lvalue, TRUE, op) < 0)
            return -1;

        emit_op(s, OP_dup);
        if (op == TOK_DOUBLE_QUESTION_MARK_ASSIGN)
            emit_op(s, OP_is_undefined_or_null);
        label1 = emit_goto(s, op == TOK_LOR_ASSIGN ? OP_if_true : OP_if_false,
                           -1);
        emit_op(s, OP_drop);
        
        if (js_parse_assign_expr2(s, parse_flags)) {
            JS_FreeAtom(s->ctx, name);
            return -1;
        }

        if (opcode == OP_get_ref_value && name == name0) {
            set_object_name(s, name);
        }
        
        switch(depth_lvalue) {
        case 1:
            emit_op(s, OP_insert2);
            break;
        case 2:
            emit_op(s, OP_insert3);
            break;
        case 3:
            emit_op(s, OP_insert4);
            break;
        default:
            abort();
        }

        /* XXX: we disable the OP_put_ref_value optimization by not
           using put_lvalue() otherwise depth_lvalue is not correct */
        put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_NOKEEP_DEPTH,
                   FALSE);
        label2 = emit_goto(s, OP_goto, -1);
        
        emit_label(s, label1);

        /* remove the lvalue stack entries */
        while (depth_lvalue != 0) {
            emit_op(s, OP_nip);
            depth_lvalue--;
        }

        emit_label(s, label2);
    }
    return 0;
}